

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  GetterXsYs<unsigned_long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  int iVar15;
  long lVar16;
  ushort uVar17;
  ImDrawIdx IVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  double dVar24;
  double dVar25;
  ImVec2 IVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar42 [16];
  
  pIVar13 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar15 = pGVar6->Count;
  lVar16 = (long)(((pGVar6->Offset + prim + 1) % iVar15 + iVar15) % iVar15) * (long)pGVar6->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar6->Xs + lVar16);
  uVar2 = *(unsigned_long_long *)((long)pGVar6->Ys + lVar16);
  dVar24 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar8 = pIVar13->CurrentPlot;
  dVar4 = (pIVar8->XAxis).Range.Min;
  iVar15 = pTVar7->YAxis;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar9->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((prim + 1 + pGVar9->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar9->Stride);
  auVar36._0_8_ = (double)CONCAT44(0x43300000,(int)uVar1);
  auVar36._8_4_ = (int)(uVar1 >> 0x20);
  auVar36._12_4_ = 0x45300000;
  IVar3 = pIVar13->PixelRange[iVar15].Min;
  fVar27 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar24 / pIVar13->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar4) + dVar4) - dVar4) + (double)IVar3.x);
  fVar29 = (float)(pIVar13->My[iVar15] *
                   ((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   pIVar8->YAxis[iVar15].Range.Min) + (double)IVar3.y);
  dVar4 = pGVar9->YRef;
  dVar25 = log10(((auVar36._8_8_ - 1.9342813113834067e+25) + (auVar36._0_8_ - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar14->CurrentPlot;
  dVar24 = (pIVar8->XAxis).Range.Min;
  iVar15 = pTVar7->YAxis;
  IVar3 = pIVar14->PixelRange[iVar15].Min;
  IVar26.x = (float)(pIVar14->Mx *
                     (((double)(float)(dVar25 / pIVar14->LogDenX) *
                       ((pIVar8->XAxis).Range.Max - dVar24) + dVar24) - dVar24) + (double)IVar3.x);
  IVar26.y = (float)(pIVar14->My[iVar15] * (dVar4 - pIVar8->YAxis[iVar15].Range.Min) +
                    (double)IVar3.y);
  fVar32 = (this->P11).x;
  fVar33 = (this->P11).y;
  fVar28 = (this->P12).x;
  fVar30 = (this->P12).y;
  uVar22 = -(uint)(fVar33 < fVar30);
  fVar31 = (float)(~-(uint)(fVar28 <= fVar32) & (uint)fVar28 |
                  (uint)fVar32 & -(uint)(fVar28 <= fVar32));
  fVar34 = (float)(~-(uint)(fVar30 <= fVar33) & (uint)fVar30 |
                  (uint)fVar33 & -(uint)(fVar30 <= fVar33));
  fVar37 = (float)(~-(uint)(fVar32 < fVar28) & (uint)fVar28 |
                  (uint)fVar32 & -(uint)(fVar32 < fVar28));
  fVar46 = (float)(~uVar22 & (uint)fVar30 | (uint)fVar33 & uVar22);
  uVar19 = -(uint)(fVar27 <= fVar31);
  uVar20 = -(uint)(fVar29 <= fVar34);
  uVar21 = -(uint)(fVar37 < fVar27);
  uVar23 = -(uint)(fVar46 < fVar29);
  fVar31 = (float)(~uVar19 & (uint)fVar27 | (uint)fVar31 & uVar19);
  fVar34 = (float)(~uVar20 & (uint)fVar29 | (uint)fVar34 & uVar20);
  fVar37 = (float)(~uVar21 & (uint)fVar27 | (uint)fVar37 & uVar21);
  fVar46 = (float)(~uVar23 & (uint)fVar29 | (uint)fVar46 & uVar23);
  uVar19 = -(uint)(IVar26.x <= fVar31);
  uVar20 = -(uint)(IVar26.y <= fVar34);
  uVar21 = -(uint)(fVar37 < IVar26.x);
  uVar23 = -(uint)(fVar46 < IVar26.y);
  auVar38._0_4_ = (uint)fVar31 & uVar19;
  auVar38._4_4_ = (uint)fVar34 & uVar20;
  auVar38._8_4_ = (uint)fVar37 & uVar21;
  auVar38._12_4_ = (uint)fVar46 & uVar23;
  auVar43._0_4_ = ~uVar19 & (uint)IVar26.x;
  auVar43._4_4_ = ~uVar20 & (uint)IVar26.y;
  auVar43._8_4_ = ~uVar21 & (uint)IVar26.x;
  auVar43._12_4_ = ~uVar23 & (uint)IVar26.y;
  auVar43 = auVar43 | auVar38;
  fVar31 = (cull_rect->Min).y;
  auVar45._4_4_ = -(uint)(fVar31 < auVar43._4_4_);
  auVar45._0_4_ = -(uint)((cull_rect->Min).x < auVar43._0_4_);
  auVar12._4_8_ = auVar43._8_8_;
  auVar12._0_4_ = -(uint)(auVar43._4_4_ < fVar31);
  auVar44._0_8_ = auVar12._0_8_ << 0x20;
  auVar44._8_4_ = -(uint)(auVar43._8_4_ < (cull_rect->Max).x);
  auVar44._12_4_ = -(uint)(auVar43._12_4_ < (cull_rect->Max).y);
  auVar45._8_8_ = auVar44._8_8_;
  iVar15 = movmskps((int)cull_rect,auVar45);
  if (iVar15 == 0xf) {
    fVar34 = fVar29 * fVar32 - fVar33 * fVar27;
    fVar37 = IVar26.y * fVar28 - fVar30 * IVar26.x;
    fVar31 = fVar30 - IVar26.y;
    auVar39._4_4_ = fVar31;
    auVar39._0_4_ = fVar31;
    auVar39._8_4_ = fVar31;
    auVar39._12_4_ = fVar31;
    auVar40._4_12_ = auVar39._4_12_;
    auVar40._0_4_ = fVar31 * (fVar32 - fVar27) - (fVar33 - fVar29) * (fVar28 - IVar26.x);
    auVar35._0_4_ = fVar34 * (fVar28 - IVar26.x) - fVar37 * (fVar32 - fVar27);
    auVar35._4_4_ = fVar34 * fVar31 - fVar37 * (fVar33 - fVar29);
    auVar35._8_4_ = fVar29 * 0.0 - IVar26.y * 0.0;
    auVar35._12_4_ = fVar29 * 0.0 - IVar26.y * 0.0;
    auVar42._0_8_ = auVar40._0_8_;
    auVar42._8_4_ = fVar31;
    auVar42._12_4_ = fVar31;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._4_4_ = auVar40._0_4_;
    auVar41._0_4_ = auVar40._0_4_;
    auVar36 = divps(auVar35,auVar41);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = this->Col;
    pIVar10[1].pos.x = fVar27;
    pIVar10[1].pos.y = fVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = this->Col;
    pIVar10[2].pos = auVar36._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = this->Col;
    pIVar10[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = this->Col;
    pIVar10[4].pos = IVar26;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar10 + 5;
    uVar19 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar19;
    *pIVar11 = IVar18;
    uVar17 = (byte)((byte)uVar22 & IVar26.y < fVar29 | -(fVar30 < fVar33) & -(fVar29 < IVar26.y)) &
             1;
    pIVar11[1] = IVar18 + uVar17 + 1;
    pIVar11[2] = IVar18 + 3;
    pIVar11[3] = IVar18 + 1;
    pIVar11[4] = (uVar17 ^ 3) + IVar18;
    pIVar11[5] = IVar18 + 4;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar19 + 5;
  }
  (this->P11).x = fVar27;
  (this->P11).y = fVar29;
  (this->P12).x = IVar26.x;
  (this->P12).y = IVar26.y;
  return (char)iVar15 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }